

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

FieldOptions * __thiscall google::protobuf::FieldOptions::New(FieldOptions *this,Arena *arena)

{
  FieldOptions *this_00;
  
  this_00 = (FieldOptions *)operator_new(0x78);
  FieldOptions(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::FieldOptions>(arena,this_00);
  }
  return this_00;
}

Assistant:

FieldOptions* FieldOptions::New(::google::protobuf::Arena* arena) const {
  FieldOptions* n = new FieldOptions;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}